

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int save_xattrs(archive_write *a,file_conflict *file)

{
  void *buff;
  void *pvVar1;
  sumalg *psVar2;
  sumalg sVar3;
  int iVar4;
  uint uVar5;
  archive_digest *paVar6;
  heap_data *__ptr;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var7;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var8;
  size_t sVar9;
  long lVar10;
  sumalg *psVar11;
  size_t size;
  void *value;
  char *name;
  size_t local_88;
  void *local_80;
  sumalg *local_78;
  file_conflict *local_70;
  wchar_t local_64;
  archive_digest *local_60;
  long local_58;
  _func_int_archive_sha1_ctx_ptr_void_ptr **local_50;
  _func_int_archive_sha1_ctx_ptr_void_ptr_size_t **local_48;
  sumalg *local_40;
  char *local_38;
  
  pvVar1 = a->format_data;
  local_70 = file;
  local_64 = archive_entry_xattr_reset(file->entry);
  if (local_64 == L'\0') {
    return 0;
  }
  psVar11 = (sumalg *)((long)pvVar1 + 0x98);
  local_78 = (sumalg *)((long)pvVar1 + 0xb0);
  local_58 = (long)pvVar1 + 200;
  buff = (void *)((long)pvVar1 + 0x120);
  local_60 = (archive_digest *)&__archive_digest.sha1init;
  local_48 = &__archive_digest.sha1update;
  local_50 = &__archive_digest.sha1final;
  local_40 = psVar11;
LAB_0017b56a:
  archive_entry_xattr_next(local_70->entry,&local_38,&local_80,&local_88);
  sVar3 = *(sumalg *)((long)pvVar1 + 0x84);
  *(sumalg *)((long)pvVar1 + 0x98) = sVar3;
  if (sVar3 == CKSUM_SHA1) {
    lVar10 = 0x10;
    paVar6 = local_60;
LAB_0017b5ac:
    (*paVar6->md5init)((archive_sha1_ctx *)(lVar10 + (long)psVar11));
    sVar3 = *(sumalg *)((long)pvVar1 + 0x84);
  }
  else if (sVar3 == CKSUM_MD5) {
    lVar10 = 8;
    paVar6 = &__archive_digest;
    goto LAB_0017b5ac;
  }
  *local_78 = sVar3;
  if (sVar3 == CKSUM_SHA1) {
    lVar10 = 0x10;
    paVar6 = local_60;
LAB_0017b5e1:
    (*paVar6->md5init)((archive_sha1_ctx *)(lVar10 + (long)local_78));
  }
  else if (sVar3 == CKSUM_MD5) {
    lVar10 = 8;
    paVar6 = &__archive_digest;
    goto LAB_0017b5e1;
  }
  __ptr = (heap_data *)calloc(1,0x80);
  psVar2 = local_78;
  if (__ptr == (heap_data *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for xattr");
    return -0x1e;
  }
  iVar4 = local_70->ea_idx;
  local_70->ea_idx = iVar4 + 1;
  __ptr->id = iVar4;
  __ptr->temp_offset = *(uint64_t *)((long)pvVar1 + 8);
  __ptr->size = local_88;
  __ptr->compression = *(enctype *)((long)pvVar1 + 0x88);
  sVar3 = *(sumalg *)((long)pvVar1 + 0xb0);
  if (sVar3 == CKSUM_SHA1) {
    lVar10 = 0x10;
    pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)local_48;
LAB_0017b668:
    (**pp_Var7)((archive_md5_ctx *)(lVar10 + (long)local_78),local_80,local_88);
    sVar3 = *psVar2;
  }
  else if (sVar3 == CKSUM_MD5) {
    lVar10 = 8;
    pp_Var7 = &__archive_digest.md5update;
    goto LAB_0017b668;
  }
  psVar2 = local_78;
  if (sVar3 == CKSUM_NONE) {
    sVar9 = 0;
LAB_0017b6c3:
    (__ptr->e_sum).len = sVar9;
  }
  else {
    if (sVar3 == CKSUM_SHA1) {
      sVar9 = 0x14;
      lVar10 = 0x10;
      pp_Var8 = (_func_int_archive_md5_ctx_ptr_void_ptr **)local_50;
LAB_0017b6a9:
      (**pp_Var8)((archive_md5_ctx *)(lVar10 + (long)local_78),(__ptr->e_sum).val);
      sVar3 = *psVar2;
      psVar11 = local_40;
      goto LAB_0017b6c3;
    }
    if (sVar3 == CKSUM_MD5) {
      sVar9 = 0x10;
      lVar10 = 8;
      pp_Var8 = &__archive_digest.md5final;
      goto LAB_0017b6a9;
    }
  }
  (__ptr->e_sum).alg = sVar3;
  if (__ptr->compression != NONE) {
    iVar4 = xar_compression_init_encoder(a);
    if (iVar4 == 0) {
      *(void **)((long)pvVar1 + 200) = local_80;
      *(size_t *)((long)pvVar1 + 0xd0) = local_88;
      do {
        if (*(int *)((long)pvVar1 + 0xf8) == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (**(code **)((long)pvVar1 + 0x108))(a,local_58,0);
          if (1 < uVar5) break;
        }
        local_88 = 0x10000 - *(long *)((long)pvVar1 + 0xe8);
        if (*(int *)((long)pvVar1 + 0x98) == 1) {
          pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
          lVar10 = 0x10;
LAB_0017b769:
          (**pp_Var7)((archive_md5_ctx *)(lVar10 + (long)psVar11),buff,local_88);
        }
        else if (*(int *)((long)pvVar1 + 0x98) == 2) {
          pp_Var7 = &__archive_digest.md5update;
          lVar10 = 8;
          goto LAB_0017b769;
        }
        iVar4 = write_to_temp(a,buff,local_88);
        if (iVar4 != 0) break;
        if (uVar5 != 0) goto LAB_0017b7cb;
        *(void **)((long)pvVar1 + 0xe0) = buff;
        *(undefined8 *)((long)pvVar1 + 0xe8) = 0x10000;
      } while( true );
    }
    goto LAB_0017b94d;
  }
  sVar3 = *psVar11;
  if (sVar3 == CKSUM_SHA1) {
    pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar10 = 0x10;
LAB_0017b813:
    (**pp_Var7)((archive_md5_ctx *)(lVar10 + (long)psVar11),local_80,local_88);
    sVar3 = *psVar11;
  }
  else if (sVar3 == CKSUM_MD5) {
    pp_Var7 = &__archive_digest.md5update;
    lVar10 = 8;
    goto LAB_0017b813;
  }
  if (sVar3 == CKSUM_NONE) {
    sVar9 = 0;
LAB_0017b865:
    (__ptr->a_sum).len = sVar9;
  }
  else {
    if (sVar3 == CKSUM_SHA1) {
      pp_Var8 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      sVar9 = 0x14;
      lVar10 = 0x10;
LAB_0017b855:
      (**pp_Var8)((archive_md5_ctx *)(lVar10 + (long)psVar11),(__ptr->a_sum).val);
      sVar3 = *psVar11;
      goto LAB_0017b865;
    }
    if (sVar3 == CKSUM_MD5) {
      pp_Var8 = &__archive_digest.md5final;
      sVar9 = 0x10;
      lVar10 = 8;
      goto LAB_0017b855;
    }
  }
  (__ptr->a_sum).alg = sVar3;
  iVar4 = write_to_temp(a,local_80,local_88);
  if (iVar4 != 0) {
LAB_0017b94d:
    free(__ptr);
    return -0x1e;
  }
  __ptr->length = local_88;
  __ptr->next = (heap_data *)0x0;
  *(local_70->xattr).last = __ptr;
  (local_70->xattr).last = &__ptr->next;
  goto LAB_0017b930;
LAB_0017b7cb:
  sVar3 = *psVar11;
  if (sVar3 == CKSUM_NONE) {
    sVar9 = 0;
  }
  else {
    if (sVar3 == CKSUM_SHA1) {
      pp_Var8 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
      sVar9 = 0x14;
      lVar10 = 0x10;
    }
    else {
      if (sVar3 != CKSUM_MD5) goto LAB_0017b8df;
      pp_Var8 = &__archive_digest.md5final;
      sVar9 = 0x10;
      lVar10 = 8;
    }
    (**pp_Var8)((archive_md5_ctx *)(lVar10 + (long)psVar11),(__ptr->a_sum).val);
    sVar3 = *psVar11;
  }
  (__ptr->a_sum).len = sVar9;
LAB_0017b8df:
  (__ptr->a_sum).alg = sVar3;
  __ptr->length = *(uint64_t *)((long)pvVar1 + 0xf0);
  __ptr->next = (heap_data *)0x0;
  *(local_70->xattr).last = __ptr;
  (local_70->xattr).last = &__ptr->next;
  if ((*(int *)((long)pvVar1 + 0xf8) != 0) &&
     (iVar4 = (**(code **)((long)pvVar1 + 0x110))(a,local_58), iVar4 != 0)) {
    return -0x1e;
  }
LAB_0017b930:
  local_64 = local_64 + L'\xffffffff';
  if (local_64 == L'\0') {
    return 0;
  }
  goto LAB_0017b56a;
}

Assistant:

static int
save_xattrs(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *name;
	const void *value;
	struct heap_data *heap;
	size_t size;
	int count, r;

	xar = (struct xar *)a->format_data;
	count = archive_entry_xattr_reset(file->entry);
	if (count == 0)
		return (ARCHIVE_OK);
	while (count--) {
		archive_entry_xattr_next(file->entry,
		    &name, &value, &size);
		checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
		checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);

		heap = calloc(1, sizeof(*heap));
		if (heap == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for xattr");
			return (ARCHIVE_FATAL);
		}
		heap->id = file->ea_idx++;
		heap->temp_offset = xar->temp_offset;
		heap->size = size;/* save a extracted size */
		heap->compression = xar->opt_compression;
		/* Get a extracted sumcheck value. */
		checksum_update(&(xar->e_sumwrk), value, size);
		checksum_final(&(xar->e_sumwrk), &(heap->e_sum));

		/*
		 * Not compression to xattr is simple way.
		 */
		if (heap->compression == NONE) {
			checksum_update(&(xar->a_sumwrk), value, size);
			checksum_final(&(xar->a_sumwrk), &(heap->a_sum));
			if (write_to_temp(a, value, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			heap->length = size;
			/* Add heap to the tail of file->xattr. */
			heap->next = NULL;
			*file->xattr.last = heap;
			file->xattr.last = &(heap->next);
			/* Next xattr */
			continue;
		}

		/*
		 * Init compression library.
		 */
		r = xar_compression_init_encoder(a);
		if (r != ARCHIVE_OK) {
			free(heap);
			return (ARCHIVE_FATAL);
		}

		xar->stream.next_in = (const unsigned char *)value;
		xar->stream.avail_in = size;
		for (;;) {
			r = compression_code(&(a->archive),
			    &(xar->stream), ARCHIVE_Z_FINISH);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			size = sizeof(xar->wbuff) - xar->stream.avail_out;
			checksum_update(&(xar->a_sumwrk),
			    xar->wbuff, size);
			if (write_to_temp(a, xar->wbuff, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			if (r == ARCHIVE_OK) {
				xar->stream.next_out = xar->wbuff;
				xar->stream.avail_out = sizeof(xar->wbuff);
			} else {
				checksum_final(&(xar->a_sumwrk),
				    &(heap->a_sum));
				heap->length = xar->stream.total_out;
				/* Add heap to the tail of file->xattr. */
				heap->next = NULL;
				*file->xattr.last = heap;
				file->xattr.last = &(heap->next);
				break;
			}
		}
		/* Clean up compression library. */
		r = compression_end(&(a->archive), &(xar->stream));
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}